

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void ShiftBytes(VP8LBitReader *br)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = br->bit_pos;
  while ((7 < iVar3 && (uVar1 = br->pos, uVar1 < br->len))) {
    uVar2 = br->val;
    br->val = uVar2 >> 8;
    br->val = (ulong)br->buf[uVar1] << 0x38 | uVar2 >> 8;
    br->pos = uVar1 + 1;
    iVar3 = iVar3 + -8;
    br->bit_pos = iVar3;
  }
  iVar3 = VP8LIsEndOfStream(br);
  if (iVar3 != 0) {
    br->bit_pos = 0;
    br->eos = 1;
  }
  return;
}

Assistant:

static void ShiftBytes(VP8LBitReader* const br) {
  while (br->bit_pos >= 8 && br->pos < br->len) {
    br->val >>= 8;
    br->val |= ((vp8l_val_t)br->buf[br->pos]) << (VP8L_LBITS - 8);
    ++br->pos;
    br->bit_pos -= 8;
  }
  if (VP8LIsEndOfStream(br)) {
    VP8LSetEndOfStream(br);
  }
}